

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxDotCross::Resolve(FxDotCross *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  PStruct *local_30;
  FCompileContext *ctx_local;
  FxDotCross *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->left != (FxExpression *)0x0) {
      iVar2 = (*this->left->_vptr_FxExpression[2])(this->left,ctx);
      this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->right != (FxExpression *)0x0) {
      iVar2 = (*this->right->_vptr_FxExpression[2])(this->right,ctx);
      this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    if ((this->right == (FxExpression *)0x0) || (this->left == (FxExpression *)0x0)) {
      if (this != (FxDotCross *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxDotCross *)0x0;
    }
    else {
      bVar1 = FxExpression::IsVector(this->left);
      if (((bVar1) && (this->left->ValueType == this->right->ValueType)) &&
         ((this->Operator != 0x167 || ((PStruct *)this->left->ValueType == TypeVector3)))) {
        if (this->Operator == 0x167) {
          local_30 = TypeVector3;
        }
        else {
          local_30 = (PStruct *)TypeFloat64;
        }
        (this->super_FxExpression).ValueType = (PType *)local_30;
      }
      else {
        pcVar3 = "dot-";
        if (this->Operator == 0x167) {
          pcVar3 = "cross-";
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Incompatible operants for %sproduct",pcVar3);
        if (this != (FxDotCross *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxDotCross *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxDotCross::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (!left->IsVector() || left->ValueType != right->ValueType || (Operator == TK_Cross && left->ValueType != TypeVector3))
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operants for %sproduct", Operator == TK_Cross ? "cross-" : "dot-");
		delete this;
		return nullptr;
	}
	ValueType = Operator == TK_Cross ? (PType*)TypeVector3 : TypeFloat64;
	return this;
}